

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O2

void nghttp2_map_print_distance(nghttp2_map *map)

{
  uint uVar1;
  nghttp2_map_bucket *pnVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 8;
  for (uVar3 = 0; uVar3 < map->tablelen; uVar3 = uVar3 + 1) {
    pnVar2 = map->table;
    if (*(long *)((long)&pnVar2->hash + lVar4) == 0) {
      fprintf(_stderr,"@%u <EMPTY>\n",uVar3 & 0xffffffff);
    }
    else {
      uVar1 = *(uint *)((long)pnVar2 + lVar4 + -8);
      fprintf(_stderr,"@%u hash=%08x key=%d base=%zu distance=%zu\n",uVar3 & 0xffffffff,(ulong)uVar1
              ,(ulong)*(uint *)((long)pnVar2 + lVar4 + -4),
              (ulong)(uVar1 >> (-(char)map->tablelenbits & 0x1fU)),0);
    }
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void nghttp2_map_print_distance(nghttp2_map *map) {
  uint32_t i;
  size_t idx;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      fprintf(stderr, "@%u <EMPTY>\n", i);
      continue;
    }

    idx = h2idx(bkt->hash, map->tablelenbits);
    fprintf(stderr, "@%u hash=%08x key=%d base=%zu distance=%zu\n", i,
            bkt->hash, bkt->key, idx,
            distance(map->tablelen, map->tablelenbits, bkt, idx));
  }
}